

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcfinal.c
# Opt level: O0

LispPTR findptrsbuffer(LispPTR ptr)

{
  LispPTR LVar1;
  LispPTR *local_18;
  buf *bptr;
  LispPTR ptr_local;
  
  local_18 = NativeAligned4FromLAddr(*System_Buffer_List_word);
  while( true ) {
    LVar1 = LAddrFromNative(local_18);
    if (LVar1 == 0) {
      return 0;
    }
    if (ptr == local_18[1]) break;
    local_18 = NativeAligned4FromLAddr(local_18[3] & 0xfffffff);
  }
  LVar1 = LAddrFromNative(local_18);
  return LVar1;
}

Assistant:

LispPTR findptrsbuffer(LispPTR ptr) {
  struct buf *bptr;
  bptr = (struct buf *)NativeAligned4FromLAddr(*System_Buffer_List_word);
  while (LAddrFromNative(bptr) != NIL) {
    if (ptr == bptr->vmempage)
      return (LAddrFromNative(bptr));
    else
      bptr = (struct buf *)NativeAligned4FromLAddr(bptr->sysnext);
  }
  return (NIL);
}